

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QTuioCursor * __thiscall
QMap<int,_QTuioCursor>::value(QMap<int,_QTuioCursor> *this,int *key,QTuioCursor *defaultValue)

{
  undefined8 uVar1;
  float fVar2;
  undefined3 uVar3;
  bool bVar4;
  pointer ppVar5;
  undefined8 *in_RCX;
  QTuioCursor *in_RDI;
  long in_FS_OFFSET;
  const_iterator i;
  QTuioCursor *this_00;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar4 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
                      *)0x114cad);
  if (bVar4) {
    local_10._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
                  *)0x114cf1);
    local_10._M_node =
         (_Base_ptr)
         std::
         map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>
         ::find((map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>
                 *)this_00,(key_type *)0x114d02);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
                  *)0x114d11);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>
         ::cend((map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>
                 *)this_00);
    bVar4 = std::operator!=(&local_10,&local_18);
    if (bVar4) {
      ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_int,_QTuioCursor>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_int,_QTuioCursor>_> *)0x114d41);
      fVar2 = (ppVar5->second).m_x;
      this_00->m_id = (ppVar5->second).m_id;
      this_00->m_x = fVar2;
      fVar2 = (ppVar5->second).m_vx;
      this_00->m_y = (ppVar5->second).m_y;
      this_00->m_vx = fVar2;
      fVar2 = (ppVar5->second).m_acceleration;
      this_00->m_vy = (ppVar5->second).m_vy;
      this_00->m_acceleration = fVar2;
      uVar3 = *(undefined3 *)&(ppVar5->second).field_0x19;
      this_00->m_state = (ppVar5->second).m_state;
      *(undefined3 *)&this_00->field_0x19 = uVar3;
    }
    else {
      uVar1 = *in_RCX;
      this_00->m_id = (int)uVar1;
      this_00->m_x = (float)(int)((ulong)uVar1 >> 0x20);
      uVar1 = in_RCX[1];
      this_00->m_y = (float)(int)uVar1;
      this_00->m_vx = (float)(int)((ulong)uVar1 >> 0x20);
      uVar1 = in_RCX[2];
      this_00->m_vy = (float)(int)uVar1;
      this_00->m_acceleration = (float)(int)((ulong)uVar1 >> 0x20);
      *(undefined4 *)&this_00->m_state = *(undefined4 *)(in_RCX + 3);
    }
  }
  else {
    uVar1 = *in_RCX;
    this_00->m_id = (int)uVar1;
    this_00->m_x = (float)(int)((ulong)uVar1 >> 0x20);
    uVar1 = in_RCX[1];
    this_00->m_y = (float)(int)uVar1;
    this_00->m_vx = (float)(int)((ulong)uVar1 >> 0x20);
    uVar1 = in_RCX[2];
    this_00->m_vy = (float)(int)uVar1;
    this_00->m_acceleration = (float)(int)((ulong)uVar1 >> 0x20);
    *(undefined4 *)&this_00->m_state = *(undefined4 *)(in_RCX + 3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }